

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

bool DepParserTask::is_valid(uint64_t action,v_array<unsigned_int> valid_actions)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((long)valid_actions._end - (long)valid_actions._begin == 0) {
    return false;
  }
  uVar2 = (long)valid_actions._end - (long)valid_actions._begin >> 2;
  bVar4 = true;
  if (*valid_actions._begin != action) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (uVar2 + (uVar2 == 0) == uVar3) break;
      uVar1 = uVar3 + 1;
    } while (valid_actions._begin[uVar3] != action);
    bVar4 = uVar3 < uVar2;
  }
  return bVar4;
}

Assistant:

bool is_valid(uint64_t action, v_array<uint32_t> valid_actions)
{
  for (size_t i = 0; i < valid_actions.size(); i++)
    if (valid_actions[i] == action)
      return true;
  return false;
}